

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_narrow.c
# Opt level: O3

TRef lj_opt_narrow_cindex(jit_State *J,TRef tr)

{
  TRef TVar1;
  
  if ((tr & 0x1f000000) == 0xe000000) {
    (J->fold).ins.field_0.op1 = (IRRef1)tr;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b1512ae;
    TVar1 = lj_opt_fold(J);
    return TVar1;
  }
  TVar1 = narrow_stripov(J,tr,0x37,0xab3);
  return TVar1;
}

Assistant:

TRef LJ_FASTCALL lj_opt_narrow_cindex(jit_State *J, TRef tr)
{
  lj_assertJ(tref_isnumber(tr), "expected number type");
  if (tref_isnum(tr))
    return emitir(IRT(IR_CONV, IRT_INTP), tr, (IRT_INTP<<5)|IRT_NUM|IRCONV_ANY);
  /* Undefined overflow semantics allow stripping of ADDOV, SUBOV and MULOV. */
  return narrow_stripov(J, tr, IR_MULOV,
			LJ_64 ? ((IRT_INTP<<5)|IRT_INT|IRCONV_SEXT) :
				((IRT_INTP<<5)|IRT_INT|IRCONV_TOBIT));
}